

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

uint sfc::max_tile_count_for_mode(Mode mode)

{
  uint uVar1;
  
  uVar1 = 0;
  if (mode - snes < 0x10) {
    uVar1 = *(uint *)(&DAT_001505b4 + (ulong)(mode - snes) * 4);
  }
  return uVar1;
}

Assistant:

constexpr unsigned max_tile_count_for_mode(Mode mode) {
  switch (mode) {
  case Mode::snes_mode7:
  case Mode::gb:
  case Mode::gba_affine:
    return 256;
  case Mode::gbc:
  case Mode::ws:
  case Mode::ngp:
  case Mode::ngpc:
  case Mode::sms:
  case Mode::gg:
    return 512;
  case Mode::snes:
  case Mode::gba:
  case Mode::wsc:
  case Mode::wsc_packed:
    return 1024;
  case Mode::md:
  case Mode::pce:
    return 2048;
  default:
    return 0;
  }
}